

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_FSA_kry.c
# Opt level: O0

void PrintFinalStats(void *cvode_mem,int sensi,int err_con,int sensi_meth)

{
  undefined4 uVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  int retval;
  long nps;
  long npe;
  long ncfl;
  long nli;
  long netfS;
  long ncfnS;
  long nniS;
  long nsetupsS;
  long nfeS;
  long nfSe;
  long netf;
  long ncfn;
  long nni;
  long nsetups;
  long nfe;
  long nst;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffff68;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  int local_14;
  int local_10;
  int local_c;
  undefined8 local_8;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  uVar1 = CVodeGetNumSteps(in_RDI,&local_20);
  check_retval(in_stack_ffffffffffffff68,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
  uVar1 = CVodeGetNumRhsEvals(local_8,&local_28);
  check_retval(in_stack_ffffffffffffff68,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
  uVar1 = CVodeGetNumLinSolvSetups(local_8,&local_30);
  check_retval(in_stack_ffffffffffffff68,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
  uVar1 = CVodeGetNumErrTestFails(local_8,&local_48);
  check_retval(in_stack_ffffffffffffff68,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
  uVar1 = CVodeGetNumNonlinSolvIters(local_8,&local_38);
  check_retval(in_stack_ffffffffffffff68,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
  uVar1 = CVodeGetNumNonlinSolvConvFails(local_8,&local_40);
  check_retval(in_stack_ffffffffffffff68,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
  if (local_c != 0) {
    uVar1 = CVodeGetSensNumRhsEvals(local_8,&local_50);
    check_retval(in_stack_ffffffffffffff68,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
    uVar1 = CVodeGetNumRhsEvalsSens(local_8,&local_58);
    check_retval(in_stack_ffffffffffffff68,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
    uVar1 = CVodeGetSensNumLinSolvSetups(local_8,&local_60);
    check_retval(in_stack_ffffffffffffff68,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
    if (local_10 == 0) {
      local_78 = 0;
    }
    else {
      uVar1 = CVodeGetSensNumErrTestFails(local_8,&local_78);
      check_retval(in_stack_ffffffffffffff68,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff5c);
    }
    if ((local_14 == 2) || (local_14 == 3)) {
      uVar1 = CVodeGetSensNumNonlinSolvIters(local_8,&local_68);
      check_retval(in_stack_ffffffffffffff68,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff5c);
      uVar1 = CVodeGetSensNumNonlinSolvConvFails(local_8,&local_70);
      check_retval(in_stack_ffffffffffffff68,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff5c);
    }
    else {
      local_68 = 0;
      local_70 = 0;
    }
  }
  uVar1 = CVodeGetNumLinIters(local_8,&local_80);
  check_retval(in_stack_ffffffffffffff68,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
  uVar1 = CVodeGetNumLinConvFails(local_8,&local_88);
  check_retval(in_stack_ffffffffffffff68,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
  uVar1 = CVodeGetNumPrecEvals(local_8,&local_90);
  check_retval(in_stack_ffffffffffffff68,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
  uVar1 = CVodeGetNumPrecSolves(local_8,&stack0xffffffffffffff68);
  check_retval(in_stack_ffffffffffffff68,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
  printf("\nFinal Statistics\n\n");
  printf("nst     = %5ld\n\n",local_20);
  printf("nfe     = %5ld\n",local_28);
  printf("netf    = %5ld    nsetups  = %5ld\n",local_48,local_30);
  printf("nni     = %5ld    ncfn     = %5ld\n",local_38,local_40);
  if (local_c != 0) {
    printf("\n");
    printf("nfSe    = %5ld    nfeS     = %5ld\n",local_50,local_58);
    printf("netfs   = %5ld    nsetupsS = %5ld\n",local_78,local_60);
    printf("nniS    = %5ld    ncfnS    = %5ld\n",local_68,local_70);
  }
  printf("\n");
  printf("nli     = %5ld    ncfl     = %5ld\n",local_80,local_88);
  printf("npe     = %5ld    nps      = %5ld\n",local_90,in_stack_ffffffffffffff68);
  return;
}

Assistant:

static void PrintFinalStats(void* cvode_mem, sunbooleantype sensi,
                            sunbooleantype err_con, int sensi_meth)
{
  long int nst;
  long int nfe, nsetups, nni, ncfn, netf;
  long int nfSe, nfeS, nsetupsS, nniS, ncfnS, netfS;
  long int nli, ncfl, npe, nps;
  int retval;

  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(&retval, "CVodeGetNumRhsEvals", 1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(&retval, "CVodeGetNumLinSolvSetups", 1);
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(&retval, "CVodeGetNumErrTestFails", 1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(&retval, "CVodeGetNumNonlinSolvIters", 1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1);

  if (sensi)
  {
    retval = CVodeGetSensNumRhsEvals(cvode_mem, &nfSe);
    check_retval(&retval, "CVodeGetSensNumRhsEvals", 1);
    retval = CVodeGetNumRhsEvalsSens(cvode_mem, &nfeS);
    check_retval(&retval, "CVodeGetNumRhsEvalsSens", 1);
    retval = CVodeGetSensNumLinSolvSetups(cvode_mem, &nsetupsS);
    check_retval(&retval, "CVodeGetSensNumLinSolvSetups", 1);
    if (err_con)
    {
      retval = CVodeGetSensNumErrTestFails(cvode_mem, &netfS);
      check_retval(&retval, "CVodeGetSensNumErrTestFails", 1);
    }
    else { netfS = 0; }
    if ((sensi_meth == CV_STAGGERED) || (sensi_meth == CV_STAGGERED1))
    {
      retval = CVodeGetSensNumNonlinSolvIters(cvode_mem, &nniS);
      check_retval(&retval, "CVodeGetSensNumNonlinSolvIters", 1);
      retval = CVodeGetSensNumNonlinSolvConvFails(cvode_mem, &ncfnS);
      check_retval(&retval, "CVodeGetSensNumNonlinSolvConvFails", 1);
    }
    else
    {
      nniS  = 0;
      ncfnS = 0;
    }
  }

  retval = CVodeGetNumLinIters(cvode_mem, &nli);
  check_retval(&retval, "CVodeGetNumLinIters", 1);
  retval = CVodeGetNumLinConvFails(cvode_mem, &ncfl);
  check_retval(&retval, "CVodeGetNumLinConvFails", 1);
  retval = CVodeGetNumPrecEvals(cvode_mem, &npe);
  check_retval(&retval, "CVodeGetNumPrecEvals", 1);
  retval = CVodeGetNumPrecSolves(cvode_mem, &nps);
  check_retval(&retval, "CVodeGetNumPrecSolves", 1);

  printf("\nFinal Statistics\n\n");
  printf("nst     = %5ld\n\n", nst);
  printf("nfe     = %5ld\n", nfe);
  printf("netf    = %5ld    nsetups  = %5ld\n", netf, nsetups);
  printf("nni     = %5ld    ncfn     = %5ld\n", nni, ncfn);

  if (sensi)
  {
    printf("\n");
    printf("nfSe    = %5ld    nfeS     = %5ld\n", nfSe, nfeS);
    printf("netfs   = %5ld    nsetupsS = %5ld\n", netfS, nsetupsS);
    printf("nniS    = %5ld    ncfnS    = %5ld\n", nniS, ncfnS);
  }

  printf("\n");
  printf("nli     = %5ld    ncfl     = %5ld\n", nli, ncfl);
  printf("npe     = %5ld    nps      = %5ld\n", npe, nps);
}